

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode ssl_cf_connect_deferred(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t blen,_Bool *done)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  ulong in_RAX;
  ssize_t sVar3;
  size_t sVar4;
  ssl_connect_data *connssl;
  CURLcode CVar5;
  curltime timestamp;
  CURLcode result;
  undefined8 uStack_38;
  
  pvVar1 = cf->ctx;
  *done = false;
  uStack_38 = in_RAX;
  if (*(int *)((long)pvVar1 + 0xc0) != 1) goto LAB_001778e6;
  uStack_38 = in_RAX & 0xffffffff;
  if (blen == 0) {
    CVar5 = CURLE_OK;
  }
  else {
    if (*(ulong *)((long)pvVar1 + 0xa8) < blen) {
      blen = *(ulong *)((long)pvVar1 + 0xa8);
    }
    sVar3 = Curl_bufq_write((bufq *)((long)pvVar1 + 0x68),(uchar *)buf,blen,
                            (CURLcode *)((long)&uStack_38 + 4));
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (cf != (Curl_cfilter *)0x0) goto LAB_00177897;
      }
      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_00177897:
        if (0 < cf->cft->log_level) {
          Curl_trc_cf_infof(data,cf,"ssl_cf_set_earlydata(len=%zu) -> %zd",blen,sVar3);
        }
      }
    }
    CVar5 = (CURLcode)(sVar3 >> 0x3f) & uStack_38._4_4_;
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  *(undefined4 *)((long)pvVar1 + 0xc0) = 2;
  sVar4 = Curl_bufq_len((bufq *)((long)pvVar1 + 0x68));
  *(size_t *)((long)pvVar1 + 0xb0) = sVar4;
LAB_001778e6:
  CVar5 = ssl_cf_connect(cf,data,done);
  if ((CVar5 == CURLE_OK) && (*done == true)) {
    timestamp._12_4_ = 0;
    timestamp._0_12_ = *(undefined1 (*) [12])((long)pvVar1 + 0x50);
    Curl_pgrsTimeWas(data,TIMER_APPCONNECT,timestamp);
    if (*(int *)((long)pvVar1 + 0xc0) == 5) {
      if ((~cf->cft->flags & 10U) != 0) {
        Curl_pgrsEarlyData(data,-*(long *)((long)pvVar1 + 0xb0));
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"Server rejected TLS early data.");
      }
      *(undefined8 *)((long)pvVar1 + 0xb0) = 0;
    }
    else if (*(int *)((long)pvVar1 + 0xc0) == 4) {
      if ((~cf->cft->flags & 10U) != 0) {
        Curl_pgrsEarlyData(data,*(curl_off_t *)((long)pvVar1 + 0xb0));
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"Server accepted %zu bytes of TLS early data.",
                   *(undefined8 *)((long)pvVar1 + 0xb0));
      }
    }
  }
  return CVar5;
}

Assistant:

static CURLcode ssl_cf_connect_deferred(struct Curl_cfilter *cf,
                                        struct Curl_easy *data,
                                        const void *buf, size_t blen,
                                        bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(connssl->state == ssl_connection_deferred);
  *done = FALSE;
  if(connssl->earlydata_state == ssl_earlydata_await) {
    result = ssl_cf_set_earlydata(cf, data, buf, blen);
    if(result)
      return result;
    /* we buffered any early data we'd like to send. Actually
     * do the connect now which sends it and performs the handshake. */
    connssl->earlydata_state = ssl_earlydata_sending;
    connssl->earlydata_skip = Curl_bufq_len(&connssl->earlydata);
  }

  result = ssl_cf_connect(cf, data, done);

  if(!result && *done) {
    Curl_pgrsTimeWas(data, TIMER_APPCONNECT, connssl->handshake_done);
    switch(connssl->earlydata_state) {
    case ssl_earlydata_none:
      break;
    case ssl_earlydata_accepted:
      if(!Curl_ssl_cf_is_proxy(cf))
        Curl_pgrsEarlyData(data, (curl_off_t)connssl->earlydata_skip);
      infof(data, "Server accepted %zu bytes of TLS early data.",
            connssl->earlydata_skip);
      break;
    case ssl_earlydata_rejected:
      if(!Curl_ssl_cf_is_proxy(cf))
        Curl_pgrsEarlyData(data, -(curl_off_t)connssl->earlydata_skip);
      infof(data, "Server rejected TLS early data.");
      connssl->earlydata_skip = 0;
      break;
    default:
      /* This should not happen. Either we do not use early data or we
       * should know if it was accepted or not. */
      DEBUGASSERT(NULL);
      break;
    }
  }
  return result;
}